

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiPVWRFromFile(ndicapi *pol,int port,char *filename)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  uint local_4b4;
  int addr;
  FILE *file;
  char hexdata [128];
  uchar buffer [1024];
  char *filename_local;
  int port_local;
  ndicapi *pol_local;
  
  pol->ErrorCode = 0;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    pol_local._4_4_ = -1;
  }
  else {
    memset(hexdata + 0x78,0,0x400);
    fread(hexdata + 0x78,1,0x400,__stream);
    iVar1 = ferror(__stream);
    if (iVar1 == 0) {
      fclose(__stream);
      for (local_4b4 = 0; (int)local_4b4 < 0x400; local_4b4 = local_4b4 + 0x40) {
        pcVar2 = ndiHexEncode((char *)&file,hexdata + (long)(int)local_4b4 + 0x78,0x40);
        ndiCommand(pol,"PVWR:%02X%04X%.128s",(ulong)(uint)port,(ulong)local_4b4,pcVar2);
        iVar1 = ndiGetError(pol);
        if (iVar1 != 0) {
          return -1;
        }
      }
      pol_local._4_4_ = 0;
    }
    else {
      fclose(__stream);
      pol_local._4_4_ = -1;
    }
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiPVWRFromFile(ndicapi* pol, int port, char* filename)
{
  unsigned char buffer[1024];
  char hexdata[128];
  FILE* file;
  int addr;

  pol->ErrorCode = 0;

  file = fopen(filename, "rb");
  if (file == NULL)
  {
    return -1;
  }

  memset(buffer, 0, 1024);      // clear buffer to zero
  fread(buffer, 1, 1024, file); // read at most 1k from file
  if (ferror(file))
  {
    fclose(file);
    return -1;
  }
  fclose(file);

  for (addr = 0; addr < 1024; addr += 64)   // write in chunks of 64 bytes
  {
    ndiPVWR(pol, port, addr, ndiHexEncode(hexdata, &buffer[addr], 64));
    if (ndiGetError(pol) != NDI_OKAY)
    {
      return -1;
    }
  }

  return 0;
}